

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O0

IBot<ttt::Board> * __thiscall
generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::Clone
          (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *this)

{
  IBot<ttt::Board> *pIVar1;
  Board *in_stack_ffffffffffffffe8;
  MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>
  *in_stack_fffffffffffffff0;
  
  pIVar1 = (IBot<ttt::Board> *)operator_new(0x18);
  MinimaxBot(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,(int)((ulong)pIVar1 >> 0x20));
  return pIVar1;
}

Assistant:

game::IBot<IGame> *Clone() const
    {
        return new MinimaxBot(this->game, depth);
    }